

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O1

void __thiscall ON_Buffer::ON_Buffer(ON_Buffer *this,ON_Buffer *src)

{
  this->m_last_error = 0;
  this->m_reserved[0] = '\0';
  this->m_reserved[1] = '\0';
  this->m_reserved[2] = '\0';
  this->m_reserved[3] = '\0';
  this->m_reserved[4] = '\0';
  this->m_reserved[5] = '\0';
  this->m_reserved[6] = '\0';
  this->m_reserved[7] = '\0';
  this->m_reserved[8] = '\0';
  this->m_reserved[9] = '\0';
  this->m_reserved[10] = '\0';
  this->m_reserved[0xb] = '\0';
  this->m_current_segment = (ON_BUFFER_SEGMENT *)0x0;
  this->m_error_handler = (ON_Buffer_ErrorHandler)0x0;
  this->m_first_segment = (ON_BUFFER_SEGMENT *)0x0;
  this->m_last_segment = (ON_BUFFER_SEGMENT *)0x0;
  this->m_buffer_size = 0;
  this->m_current_position = 0;
  Copy(this,src);
  return;
}

Assistant:

ON_Buffer::ON_Buffer( const ON_Buffer& src )
: m_buffer_size(0)
, m_current_position(0)
, m_first_segment(0)
, m_last_segment(0)
, m_current_segment(0)
, m_error_handler(0)
, m_last_error(0)
{
  memset(m_reserved,0,sizeof(m_reserved));
  Copy(src);
}